

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
           *this)

{
  int iVar1;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar2;
  pointer pAVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  int con_index;
  double dVar8;
  double dVar9;
  ArgList local_58;
  BasicProblem<mp::BasicProblemParams<int>_> *local_48;
  undefined8 uStack_40;
  
  iVar1 = *(int *)(*(long *)(this + 8) + 4);
  if (0 < iVar1) {
    con_index = 0;
    dVar8 = 0.0;
    dVar9 = 0.0;
    do {
      this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
      pcVar2 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      dVar4 = -INFINITY;
      dVar5 = INFINITY;
      switch(*pcVar2) {
      case '0':
        dVar4 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        dVar5 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                          (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
        break;
      case '1':
        dVar5 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        dVar4 = -INFINITY;
        break;
      case '2':
        dVar4 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        dVar5 = INFINITY;
        break;
      case '3':
        break;
      case '4':
        dVar4 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        dVar5 = dVar4;
        break;
      case '5':
        uVar6 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this_00);
        uVar7 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                          (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
        if ((uVar7 == 0) || (**(int **)(this + 8) < (int)uVar7)) {
          local_48 = (BasicProblem<mp::BasicProblemParams<int>_> *)(ulong)uVar7;
          local_58.types_ = 2;
          local_58.field_1.values_ = (Value *)&local_48;
          BinaryReaderBase::ReportError(*(BinaryReaderBase **)this,(CStringRef)0x4b86e6,&local_58);
        }
        BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                  (*(BasicProblem<mp::BasicProblemParams<int>_> **)(*(long *)(this + 0x10) + 8),
                   con_index,uVar7 - 1,(ComplInfo)(uVar6 & 3));
        goto LAB_0045da22;
      default:
        local_48 = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        uStack_40._0_4_ = 0;
        uStack_40._4_4_ = 0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)&local_48;
        BinaryReaderBase::ReportError
                  (&this_00->super_BinaryReaderBase,(CStringRef)0x4b8876,&local_58);
        dVar4 = dVar8;
        dVar5 = dVar9;
      }
      dVar9 = dVar5;
      dVar8 = dVar4;
      BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::MutAlgebraicCon
                ((MutAlgebraicCon *)&local_48,
                 *(BasicProblem<mp::BasicProblemParams<int>_> **)(*(long *)(this + 0x10) + 8),
                 con_index);
      pAVar3 = (local_48->algebraic_cons_).
               super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar3[(int)uStack_40].lb = dVar8;
      pAVar3[(int)uStack_40].ub = dVar9;
LAB_0045da22:
      con_index = con_index + 1;
    } while (iVar1 != con_index);
  }
  return;
}

Assistant:

int num_items() const { return this->reader_.header_.num_algebraic_cons; }